

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.h
# Opt level: O0

void PrintHelp(void)

{
  fprintf(_stderr,
          "ark_harmonic_symplectic: an ARKODE example demonstrating the SPRKStep time-stepping module solving a simple harmonic oscillator\n"
         );
  fprintf(_stderr,"  --order <int>               the order of the method to use (default 4)\n");
  fprintf(_stderr,"  --dt <Real>                 the fixed-time step size to use (default 0.01)\n");
  fprintf(_stderr,"  --nout <int>                the number of output times (default 100)\n");
  fprintf(_stderr,
          "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
         );
  fprintf(_stderr,"  --disable-tstop             turns off tstop mode\n");
  return;
}

Assistant:

static void PrintHelp(void)
{
  fprintf(stderr, "ark_harmonic_symplectic: an ARKODE example demonstrating "
                  "the SPRKStep time-stepping module solving a simple harmonic "
                  "oscillator\n");
  /* clang-format off */
  fprintf(stderr, "  --order <int>               the order of the method to use (default 4)\n");
  fprintf(stderr, "  --dt <Real>                 the fixed-time step size to use (default 0.01)\n");
  fprintf(stderr, "  --nout <int>                the number of output times (default 100)\n");
  fprintf(stderr, "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n");
  fprintf(stderr, "  --disable-tstop             turns off tstop mode\n");
  /* clang-format on */
}